

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void write_rbsp_slice_trailing_bits(h264_stream_t *h,bs_t *b)

{
  int iVar1;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  write_rbsp_trailing_bits(b);
  if (h->pps->entropy_coding_mode_flag != 0) {
    while (iVar1 = more_rbsp_trailing_data(h,b), iVar1 != 0) {
      bs_write_u(b,0x10,0);
    }
  }
  return;
}

Assistant:

void write_rbsp_slice_trailing_bits(h264_stream_t* h, bs_t* b)
{
    write_rbsp_trailing_bits(b);
    if( h->pps->entropy_coding_mode_flag )
    {
        while( more_rbsp_trailing_data(h, b) )
        {
            /* cabac_zero_word */ bs_write_u(b, 16, 0x0000);
        }
    }
}